

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall
Minisat::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Minisat::Lit> *out_clause)

{
  uint64_t *puVar1;
  int iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  undefined8 in_RAX;
  anon_struct_8_10_eb538618_for_header aVar5;
  ulong uVar6;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  puVar1 = &(this->super_Solver).counter;
  *puVar1 = *puVar1 + 1;
  aVar5 = _ps->header;
  local_38 = in_RAX;
  if ((ulong)aVar5 >> 0x22 != 0) {
    uVar6 = 0;
    do {
      iVar2 = *(int *)(&_ps[1].header.field_0x0 + uVar6 * 4);
      if (iVar2 >> 1 != v) {
        local_38 = CONCAT44(iVar2,local_38._0_4_);
        vec<Minisat::Lit>::push(out_clause,(Lit *)((long)&local_38 + 4));
        (this->super_Solver).seen2.data[*(int *)(&_ps[1].header.field_0x0 + uVar6 * 4)] =
             (this->super_Solver).counter;
        aVar5 = _ps->header;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)aVar5 >> 0x22);
  }
  aVar5 = _qs->header;
  if (0x3ffffffff < (ulong)aVar5) {
    uVar6 = 0;
    do {
      iVar2 = *(int *)(&_qs[1].header.field_0x0 + uVar6 * 4);
      if (iVar2 >> 1 != v) {
        puVar3 = (this->super_Solver).seen2.data;
        uVar4 = (this->super_Solver).counter;
        if (puVar3[iVar2] != uVar4) {
          if (puVar3[(long)iVar2 ^ 1] == uVar4) {
            return false;
          }
          local_38 = CONCAT44(local_38._4_4_,iVar2);
          vec<Minisat::Lit>::push(out_clause,(Lit *)&local_38);
          aVar5 = _qs->header;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)aVar5 >> 0x22);
  }
  return true;
}

Assistant:

bool SimpSolver::merge(const Clause &_ps, const Clause &_qs, Var v, vec<Lit> &out_clause)
{
    merges++;
    out_clause.clear();
    counter++;

    for (int i = 0; i < _ps.size(); i++) {
        if (var(_ps[i]) != v) {
            out_clause.push(_ps[i]);
            seen2[_ps[i].x] = counter;
        }
    }

    for (int i = 0; i < _qs.size(); i++) {
        if (var(_qs[i]) != v) {
            if (seen2[_qs[i].x] != counter) {
                if (seen2[(~_qs[i]).x] != counter) {
                    out_clause.push(_qs[i]);
                } else {
                    return false;
                }
            }
        }
    }

    return true;
}